

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O1

int Cudd_zddPrintDebug(DdManager *zdd,DdNode *f,int n,int pr)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  double dVar4;
  
  if ((pr < 1) || (zdd->zero != f)) {
    if (pr < 1) {
      return 1;
    }
    uVar1 = Cudd_zddDagSize(f);
    dVar4 = Cudd_zddCountMinterm(zdd,f,n);
    uVar3 = (uint)(dVar4 != -1.0 && uVar1 != 0xffffffff);
    fprintf((FILE *)zdd->out,": %d nodes %g minterms\n",(ulong)uVar1);
    if ((2 < pr) && (iVar2 = cuddZddP(zdd,f), iVar2 == 0)) {
      uVar3 = 0;
    }
    if (pr == 2 || 3 < pr) {
      iVar2 = Cudd_zddPrintMinterm(zdd,f);
      if (iVar2 == 0) {
        uVar3 = 0;
      }
      fputc(10,(FILE *)zdd->out);
    }
  }
  else {
    fwrite(": is the empty ZDD\n",0x13,1,(FILE *)zdd->out);
    uVar3 = 1;
  }
  fflush((FILE *)zdd->out);
  return uVar3;
}

Assistant:

int
Cudd_zddPrintDebug(
  DdManager * zdd,
  DdNode * f,
  int  n,
  int  pr)
{
    DdNode      *empty = DD_ZERO(zdd);
    int         nodes;
    double      minterms;
    int         retval = 1;

    if (f == empty && pr > 0) {
        (void) fprintf(zdd->out,": is the empty ZDD\n");
        (void) fflush(zdd->out);
        return(1);
    }

    if (pr > 0) {
        nodes = Cudd_zddDagSize(f);
        if (nodes == CUDD_OUT_OF_MEM) retval = 0;
        minterms = Cudd_zddCountMinterm(zdd, f, n);
        if (minterms == (double)CUDD_OUT_OF_MEM) retval = 0;
        (void) fprintf(zdd->out,": %d nodes %g minterms\n",
                       nodes, minterms);
        if (pr > 2)
            if (!cuddZddP(zdd, f)) retval = 0;
        if (pr == 2 || pr > 3) {
            if (!Cudd_zddPrintMinterm(zdd, f)) retval = 0;
            (void) fprintf(zdd->out,"\n");
        }
        (void) fflush(zdd->out);
    }
    return(retval);

}